

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  float *pfVar5;
  size_t *ix_arr_00;
  unsigned_long *puVar6;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar7;
  int *piVar8;
  double dVar9;
  double dVar10;
  long in_stack_00000008;
  int in_stack_00000010;
  double out;
  double v;
  double sn;
  size_t *row_2;
  size_t *row_1;
  double xval;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  size_t row;
  double cnt;
  double w_this;
  double x_sq;
  double s4;
  double s3;
  double s2;
  double s1;
  unsigned_long *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  double local_e8;
  unsigned_long *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 uVar11;
  unsigned_long *in_stack_ffffffffffffff30;
  ulong *in_stack_ffffffffffffff48;
  ulong *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  unsigned_long *st_00;
  float *local_90;
  float *Xc_00;
  MissingAction missing_action_00;
  double local_70;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_8;
  
  if (*(int *)(in_stack_00000008 + in_RCX * 4) == *(int *)(in_stack_00000008 + 4 + in_RCX * 4)) {
    local_8 = -INFINITY;
  }
  else {
    local_40 = 0.0;
    local_48 = 0.0;
    local_50 = 0.0;
    local_58 = 0.0;
    local_70 = 0.0;
    for (; in_RSI <= in_RDX; in_RSI = in_RSI + 1) {
      pdVar4 = tsl::
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff08);
      local_70 = *pdVar4 + local_70;
    }
    if (0.0 < local_70) {
      local_90 = (float *)(long)*(int *)(in_stack_00000008 + in_RCX * 4);
      pfVar5 = (float *)(long)(*(int *)(in_stack_00000008 + 4 + in_RCX * 4) + -1);
      ix_arr_00 = (size_t *)(long)*(int *)(in_R9 + (long)pfVar5 * 4);
      Xc_00 = local_90;
      puVar6 = std::lower_bound<unsigned_long*,int>
                         (in_stack_ffffffffffffff30,
                          (unsigned_long *)
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              in_stack_ffffffffffffff28)))),
                          (int *)in_stack_ffffffffffffff20);
      st_00 = puVar6;
      if (in_stack_00000010 == 0) {
        while( true ) {
          missing_action_00 = (MissingAction)in_RSI;
          uVar11 = false;
          if ((puVar6 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (uVar11 = false, local_90 != (float *)((long)pfVar5 + 1))) {
            uVar11 = (size_t *)*puVar6 <= ix_arr_00;
          }
          in_stack_ffffffffffffff48 = puVar6;
          if ((bool)uVar11 == false) break;
          if (*(int *)(in_R9 + (long)local_90 * 4) == (int)*puVar6) {
            pdVar4 = tsl::
                     robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  in_stack_ffffffffffffff08);
            dVar9 = *pdVar4;
            in_stack_ffffffffffffff58 = (double)*(float *)(in_R8 + (long)local_90 * 4);
            dVar7 = in_stack_ffffffffffffff58 * in_stack_ffffffffffffff58;
            local_40 = fma(dVar9,in_stack_ffffffffffffff58,local_40);
            local_48 = fma(dVar9,dVar7,local_48);
            local_50 = fma(dVar9,dVar7 * in_stack_ffffffffffffff58,local_50);
            local_58 = fma(dVar9,dVar7 * dVar7,local_58);
            missing_action_00 = (MissingAction)in_RSI;
            in_stack_ffffffffffffff48 = puVar6;
            if ((puVar6 == (ulong *)(in_RDI + in_RDX * 8)) || (local_90 == pfVar5)) break;
            puVar6 = puVar6 + 1;
            piVar8 = std::lower_bound<int*,unsigned_long>
                               ((int *)in_stack_ffffffffffffff30,
                                (int *)CONCAT17(in_stack_ffffffffffffff2f,
                                                CONCAT16(in_stack_ffffffffffffff2e,
                                                         CONCAT15(uVar11,CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (float *)((long)piVar8 - in_R9 >> 2);
          }
          else if ((int)*puVar6 < *(int *)(in_R9 + (long)local_90 * 4)) {
            puVar6 = std::lower_bound<unsigned_long*,int>
                               (in_stack_ffffffffffffff30,
                                (unsigned_long *)
                                CONCAT17(in_stack_ffffffffffffff2f,
                                         CONCAT16(in_stack_ffffffffffffff2e,
                                                  CONCAT15(uVar11,CONCAT14(in_stack_ffffffffffffff2c
                                                                           ,
                                                  in_stack_ffffffffffffff28)))),
                                (int *)in_stack_ffffffffffffff20);
          }
          else {
            piVar8 = std::lower_bound<int*,unsigned_long>
                               ((int *)in_stack_ffffffffffffff30,
                                (int *)CONCAT17(in_stack_ffffffffffffff2f,
                                                CONCAT16(in_stack_ffffffffffffff2e,
                                                         CONCAT15(uVar11,CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (float *)((long)piVar8 - in_R9 >> 2);
          }
        }
      }
      else {
        while( true ) {
          missing_action_00 = (MissingAction)in_RSI;
          uVar11 = false;
          if ((puVar6 != (ulong *)(in_RDI + in_RDX * 8 + 8)) &&
             (uVar11 = false, local_90 != (float *)((long)pfVar5 + 1))) {
            uVar11 = (size_t *)*puVar6 <= ix_arr_00;
          }
          if ((bool)uVar11 == false) break;
          if (*(int *)(in_R9 + (long)local_90 * 4) == (int)*puVar6) {
            pdVar4 = tsl::
                     robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::operator[]((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  in_stack_ffffffffffffff08);
            dVar9 = *pdVar4;
            in_stack_ffffffffffffff58 = (double)*(float *)(in_R8 + (long)local_90 * 4);
            uVar3 = std::isnan(in_stack_ffffffffffffff58);
            in_stack_ffffffffffffff2e = 1;
            if ((uVar3 & 1) == 0) {
              iVar2 = std::isinf(in_stack_ffffffffffffff58);
              in_stack_ffffffffffffff2e = (byte)iVar2;
            }
            if ((in_stack_ffffffffffffff2e & 1) == 0) {
              dVar7 = in_stack_ffffffffffffff58 * in_stack_ffffffffffffff58;
              local_40 = fma(dVar9,in_stack_ffffffffffffff58,local_40);
              local_48 = fma(dVar9,dVar7,local_48);
              local_50 = fma(dVar9,dVar7 * in_stack_ffffffffffffff58,local_50);
              local_58 = fma(dVar9,dVar7 * dVar7,local_58);
            }
            else {
              local_70 = local_70 - dVar9;
            }
            missing_action_00 = (MissingAction)in_RSI;
            if ((puVar6 == (ulong *)(in_RDI + in_RDX * 8)) || (local_90 == pfVar5)) break;
            puVar6 = puVar6 + 1;
            piVar8 = std::lower_bound<int*,unsigned_long>
                               ((int *)in_stack_ffffffffffffff30,
                                (int *)CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff2e,
                                                                CONCAT15(in_stack_ffffffffffffff2d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (float *)((long)piVar8 - in_R9 >> 2);
          }
          else if ((int)*puVar6 < *(int *)(in_R9 + (long)local_90 * 4)) {
            puVar6 = std::lower_bound<unsigned_long*,int>
                               (in_stack_ffffffffffffff30,
                                (unsigned_long *)
                                CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff2e,
                                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                                  CONCAT14(in_stack_ffffffffffffff2c
                                                                           ,
                                                  in_stack_ffffffffffffff28)))),
                                (int *)in_stack_ffffffffffffff20);
          }
          else {
            piVar8 = std::lower_bound<int*,unsigned_long>
                               ((int *)in_stack_ffffffffffffff30,
                                (int *)CONCAT17(uVar11,CONCAT16(in_stack_ffffffffffffff2e,
                                                                CONCAT15(in_stack_ffffffffffffff2d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28)))),
                                in_stack_ffffffffffffff20);
            local_90 = (float *)((long)piVar8 - in_R9 >> 2);
          }
        }
        in_stack_ffffffffffffff50 = puVar6;
        if (local_70 <= 0.0) {
          return -INFINITY;
        }
      }
      bVar1 = true;
      if (1.0 < local_70) {
        bVar1 = true;
        if ((local_48 != 0.0) || (NAN(local_48))) {
          bVar1 = local_48 == local_40 * local_40;
        }
      }
      if (bVar1) {
        local_8 = -INFINITY;
      }
      else {
        piVar8 = (int *)(local_40 / local_70);
        dVar9 = -(double)piVar8 * (double)piVar8 + local_48 / local_70;
        uVar3 = std::isnan(dVar9);
        if ((uVar3 & 1) == 0) {
          dVar7 = dVar9;
          dVar10 = std::numeric_limits<double>::epsilon();
          if ((dVar10 < dVar7) ||
             (bVar1 = check_more_than_two_unique_values<float,int>
                                (ix_arr_00,(size_t)st_00,(size_t)in_stack_ffffffffffffff58,
                                 (size_t)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48,
                                 piVar8,Xc_00,missing_action_00), bVar1)) {
            if (dVar9 <= 0.0) {
              local_8 = 0.0;
            }
            else {
              local_e8 = (local_70 *
                          (double)piVar8 * (double)piVar8 * (double)piVar8 * (double)piVar8 +
                         -(local_40 * 4.0) * (double)piVar8 * (double)piVar8 * (double)piVar8 +
                         local_48 * 6.0 * (double)piVar8 * (double)piVar8 +
                         -(local_50 * 4.0) * (double)piVar8 + local_58) / (local_70 * dVar9 * dVar9)
              ;
              uVar3 = std::isnan(local_e8);
              if (((uVar3 & 1) == 0) && (uVar3 = std::isinf(local_e8), (uVar3 & 1) == 0)) {
                if (local_e8 <= 0.0) {
                  local_e8 = 0.0;
                }
              }
              else {
                local_e8 = -INFINITY;
              }
              local_8 = local_e8;
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
    else {
      local_8 = -INFINITY;
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}